

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O0

bool slang::ast::Bitstream::canBeSource
               (Type *target,StreamingConcatenationExpression *rhs,SourceRange assignmentRange,
               ASTContext *context)

{
  SourceRange range;
  SourceRange range_00;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  bool bVar1;
  SourceLocation SVar2;
  SourceLocation SVar3;
  SourceLocation in_RCX;
  SourceLocation in_RDX;
  StreamingConcatenationExpression *in_RSI;
  undefined8 in_R8;
  Diagnostic *diag;
  uint64_t sourceWidth;
  uint64_t targetWidth;
  Diagnostic *in_stack_ffffffffffffff70;
  SourceLocation in_stack_ffffffffffffff78;
  SourceLocation in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  SourceLocation in_stack_ffffffffffffff90;
  SourceLocation in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  DiagCode code;
  Type *in_stack_ffffffffffffffb8;
  bool local_1;
  
  code = SUB84((ulong)in_stack_ffffffffffffffa0 >> 0x20,0);
  bVar1 = Type::isBitstreamType((Type *)in_RSI,SUB81((ulong)in_R8 >> 0x38,0));
  if (bVar1) {
    bVar1 = ASTContext::inUnevaluatedBranch((ASTContext *)in_stack_ffffffffffffff70);
    if (bVar1) {
      local_1 = true;
    }
    else {
      bVar1 = Type::isFixedSize(in_stack_ffffffffffffffb8);
      if (bVar1) {
        SVar2 = (SourceLocation)Type::getBitstreamWidth((Type *)in_stack_ffffffffffffff78);
        SVar3 = (SourceLocation)StreamingConcatenationExpression::getBitstreamWidth(in_RSI);
        if ((ulong)SVar2 < (ulong)SVar3) {
          sourceRange_00.endLoc = SVar3;
          sourceRange_00.startLoc = in_stack_ffffffffffffff90;
          ASTContext::addDiag((ASTContext *)CONCAT44(0x2c0007,in_stack_ffffffffffffff88),SVar2._4_4_
                              ,sourceRange_00);
          Diagnostic::operator<<<unsigned_long>((Diagnostic *)in_RCX,(unsigned_long)in_RDX);
          Diagnostic::operator<<<unsigned_long>((Diagnostic *)in_RCX,(unsigned_long)in_RDX);
          range_00.endLoc = in_RCX;
          range_00.startLoc = in_RDX;
          Diagnostic::operator<<
                    ((Diagnostic *)(in_RSI->super_Expression).sourceRange.endLoc,range_00);
          local_1 = false;
        }
        else {
          local_1 = true;
        }
      }
      else {
        local_1 = true;
      }
    }
  }
  else {
    sourceRange.endLoc = in_stack_ffffffffffffff98;
    sourceRange.startLoc = in_stack_ffffffffffffff90;
    ASTContext::addDiag((ASTContext *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                        code,sourceRange);
    ast::operator<<((Diagnostic *)in_RCX,(Type *)in_RDX);
    range.endLoc = in_stack_ffffffffffffff80;
    range.startLoc = in_stack_ffffffffffffff78;
    Diagnostic::operator<<(in_stack_ffffffffffffff70,range);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Bitstream::canBeSource(const Type& target, const StreamingConcatenationExpression& rhs,
                            SourceRange assignmentRange, const ASTContext& context) {
    // No need to checkClassAccess here because a class is never a valid
    // destination bitstream type.
    if (!target.isBitstreamType(true)) {
        context.addDiag(diag::BadStreamTargetType, assignmentRange) << target << rhs.sourceRange;
        return false;
    }

    if (context.inUnevaluatedBranch())
        return true; // No size check in an unevaluated conditional branch
    if (!target.isFixedSize())
        return true; // Sizes checked at constant evaluation or runtime

    auto targetWidth = target.getBitstreamWidth();
    auto sourceWidth = rhs.getBitstreamWidth();
    if (targetWidth < sourceWidth) {
        auto& diag = context.addDiag(diag::BadStreamSize, assignmentRange)
                     << targetWidth << sourceWidth;
        diag << rhs.sourceRange;
        return false;
    }

    return true;
}